

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlSetListDoc(xmlNodePtr list,xmlDocPtr doc)

{
  int iVar1;
  int local_2c;
  _xmlNode *p_Stack_28;
  int ret;
  xmlNodePtr cur;
  xmlDocPtr doc_local;
  xmlNodePtr list_local;
  
  local_2c = 0;
  if ((list == (xmlNodePtr)0x0) || (p_Stack_28 = list, list->type == XML_NAMESPACE_DECL)) {
    list_local._4_4_ = 0;
  }
  else {
    for (; p_Stack_28 != (xmlNodePtr)0x0; p_Stack_28 = p_Stack_28->next) {
      if ((p_Stack_28->doc != doc) && (iVar1 = xmlSetTreeDoc(p_Stack_28,doc), iVar1 < 0)) {
        local_2c = -1;
      }
    }
    list_local._4_4_ = local_2c;
  }
  return list_local._4_4_;
}

Assistant:

int
xmlSetListDoc(xmlNodePtr list, xmlDocPtr doc) {
    xmlNodePtr cur;
    int ret = 0;

    if ((list == NULL) || (list->type == XML_NAMESPACE_DECL))
	return(0);

    cur = list;
    while (cur != NULL) {
	if (cur->doc != doc) {
	    if (xmlSetTreeDoc(cur, doc) < 0)
                ret = -1;
        }
	cur = cur->next;
    }

    return(ret);
}